

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O3

void __thiscall
TApp_IniConfigurable_Test::~TApp_IniConfigurable_Test(TApp_IniConfigurable_Test *this)

{
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_00171700;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_TApp).args);
  CLI::App::~App(&(this->super_TApp).app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniConfigurable) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);
    bool value;
    app.add_flag("--val", value)->configurable(true);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_NO_THROW(run());
    EXPECT_TRUE(value);
}